

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool>
               (interval_t *ldata,date_t *rdata,timestamp_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 left;
  undefined4 left_00;
  bool bVar1;
  ulong uVar2;
  timestamp_t tVar3;
  ulong uVar4;
  ValidityMask *pVVar5;
  idx_t i_1;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t i;
  ulong uVar6;
  idx_t row_idx_01;
  interval_t right;
  interval_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)lsel->sel_vector[uVar6];
      }
      uVar4 = uVar6;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)rsel->sel_vector[uVar6];
      }
      left = ldata[uVar2].months;
      right.micros = uVar4;
      right._0_8_ = ldata[uVar2].micros;
      tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                        ((AddOperator *)(ulong)(uint)rdata[uVar4].days,(date_t)left,right);
      result_data[uVar6].value = tVar3.value;
    }
  }
  else {
    pVVar5 = lvalidity;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      row_idx_00 = row_idx;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[row_idx];
      }
      row_idx_01 = row_idx;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)rsel->sel_vector[row_idx];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_014d3895;
        left_00 = ldata[row_idx_00].months;
        right_00.micros = (int64_t)pVVar5;
        right_00._0_8_ = ldata[row_idx_00].micros;
        tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)(uint)rdata[row_idx_01].days,(date_t)left_00,
                           right_00);
        result_data[row_idx].value = tVar3.value;
        pVVar5 = (ValidityMask *)result_data;
      }
      else {
LAB_014d3895:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}